

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataViewDefault.cpp
# Opt level: O2

bool __thiscall
Rml::DataViewCommon::Initialize
          (DataViewCommon *this,DataModel *model,Element *element,String *expression_str,
          String *in_modifier)

{
  DataModel *__p;
  bool bVar1;
  DataExpressionInterface expr_interface;
  DataExpressionInterface local_40;
  
  if ((this->modifier)._M_string_length == 0) {
    ::std::__cxx11::string::_M_assign((string *)&this->modifier);
  }
  ::std::make_unique<Rml::DataExpression,std::__cxx11::string_const&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_40);
  __p = local_40.data_model;
  local_40.data_model = (DataModel *)0x0;
  ::std::__uniq_ptr_impl<Rml::DataExpression,_std::default_delete<Rml::DataExpression>_>::reset
            ((__uniq_ptr_impl<Rml::DataExpression,_std::default_delete<Rml::DataExpression>_> *)
             &this->expression,(pointer)__p);
  ::std::unique_ptr<Rml::DataExpression,_std::default_delete<Rml::DataExpression>_>::~unique_ptr
            ((unique_ptr<Rml::DataExpression,_std::default_delete<Rml::DataExpression>_> *)&local_40
            );
  DataExpressionInterface::DataExpressionInterface(&local_40,model,element,(Event *)0x0);
  bVar1 = DataExpression::Parse
                    ((this->expression)._M_t.
                     super___uniq_ptr_impl<Rml::DataExpression,_std::default_delete<Rml::DataExpression>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_Rml::DataExpression_*,_std::default_delete<Rml::DataExpression>_>
                     .super__Head_base<0UL,_Rml::DataExpression_*,_false>._M_head_impl,&local_40,
                     false);
  return bVar1;
}

Assistant:

bool DataViewCommon::Initialize(DataModel& model, Element* element, const String& expression_str, const String& in_modifier)
{
	// The modifier can be overriden in the constructor
	if (modifier.empty())
		modifier = in_modifier;

	expression = MakeUnique<DataExpression>(expression_str);
	DataExpressionInterface expr_interface(&model, element);

	bool result = expression->Parse(expr_interface, false);
	return result;
}